

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * __thiscall
chaiscript::exception::eval_error::format_types_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,Const_Proxy_Function *t_func,
          bool t_dot_notation,Dispatch_Engine *t_ss)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  long *plVar3;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  shared_ptr<chaiscript::AST_Node> *extraout_RDX;
  shared_ptr<chaiscript::AST_Node> *extraout_RDX_00;
  shared_ptr<chaiscript::AST_Node> *extraout_RDX_01;
  shared_ptr<chaiscript::AST_Node> *extraout_RDX_02;
  shared_ptr<chaiscript::AST_Node> *extraout_RDX_03;
  shared_ptr<chaiscript::AST_Node> *t;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  string paramstr;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  stringstream ss;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [24];
  _Alloc_hider local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  iVar1 = *(int *)(*(long *)this + 0x20);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_1d8,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
             (*(long *)this + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iVar1 == -1) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x26b860);
    if ((char)t_func != '\0') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     "(Object).",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
    }
  }
  else if ((ulong)(((long)(local_1d8._8_8_ - local_1d8._0_8_) >> 3) * -0x5555555555555555) < 2) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x27397d);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8[0]._M_local_buf,"(",1);
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    local_1f8._8_8_ = 0;
    local_1e8._M_local_buf[0] = '\0';
    if (local_1d8._8_8_ - local_1d8._0_8_ != 0x18) {
      lVar5 = 1;
      lVar6 = 0x18;
      local_1c0._M_p = (pointer)this;
      do {
        std::__cxx11::string::append(local_1f8._M_local_buf);
        detail::Dispatch_Engine::get_type_name_abi_cxx11_
                  ((string *)local_218,
                   (Dispatch_Engine *)CONCAT71(in_register_00000009,t_dot_notation),
                   (Type_Info *)((long)(type_info **)local_1d8._0_8_ + lVar6));
        std::__cxx11::string::_M_append(local_1f8._M_local_buf,local_218._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._0_8_ != &local_208) {
          operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
        }
        if ((lVar5 != 1 || (char)t_func != '\x01') ||
           (std::__cxx11::string::append(local_1f8._M_local_buf),
           local_1d8._8_8_ - local_1d8._0_8_ == 0x30)) {
          std::__cxx11::string::append(local_1f8._M_local_buf);
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x18;
        this = (eval_error *)local_1c0._M_p;
      } while (lVar5 != ((long)(local_1d8._8_8_ - local_1d8._0_8_) >> 3) * -0x5555555555555555);
    }
    std::__cxx11::string::substr((ulong)local_218,(ulong)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8[0]._M_local_buf,(char *)local_218._0_8_,local_218._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._0_8_ != &local_208) {
      operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8[0]._M_local_buf,")",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._0_8_ != &local_208) {
      operator_delete((void *)local_218._0_8_,local_208._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_allocated_capacity != &local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1)
      ;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (*(long *)this != 0) {
    auVar7 = __dynamic_cast(*(long *)this,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,
                            &chaiscript::dispatch::Dynamic_Proxy_Function::typeinfo,0);
    t = auVar7._8_8_;
    lVar5 = auVar7._0_8_;
    if (lVar5 != 0) {
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      lVar6 = *(long *)(lVar5 + 0x60);
      this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 0x68);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      if (lVar6 != 0) {
        auVar7 = __dynamic_cast(lVar6,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,
                                &chaiscript::dispatch::Dynamic_Proxy_Function::typeinfo,0);
        t = auVar7._8_8_;
        lVar6 = auVar7._0_8_;
        if (lVar6 != 0) {
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          puVar2 = *(undefined8 **)(lVar6 + 0x70);
          this_02 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x78);
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_02->_M_use_count = this_02->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_02->_M_use_count = this_02->_M_use_count + 1;
            }
          }
          (**(code **)*puVar2)(&local_1f8);
          plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x27a2d5);
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar4) {
            local_1a8[0]._0_8_ = paVar4->_M_allocated_capacity;
            local_1a8[0]._8_8_ = plVar3[3];
            local_1b8._0_8_ = local_1a8;
          }
          else {
            local_1a8[0]._0_8_ = paVar4->_M_allocated_capacity;
            local_1b8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar3;
          }
          local_1b8._8_8_ = plVar3[1];
          *plVar3 = (long)paVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b8._0_8_);
          t = extraout_RDX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._0_8_ != local_1a8) {
            operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
            t = extraout_RDX_00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_allocated_capacity != &local_1e8) {
            operator_delete((void *)local_1f8._M_allocated_capacity,
                            CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]
                                    ) + 1);
            t = extraout_RDX_01;
          }
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
            t = extraout_RDX_02;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            t = extraout_RDX_03;
          }
        }
      }
      local_218._0_8_ = *(undefined8 *)(lVar5 + 0x70);
      local_218._8_8_ = *(long *)(lVar5 + 0x78);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_)->_M_use_count + 1;
        }
      }
      format_location<std::shared_ptr<chaiscript::AST_Node>>
                ((string *)&local_1f8,(eval_error *)local_218,t);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x26b870);
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 == paVar4) {
        local_1a8[0]._0_8_ = paVar4->_M_allocated_capacity;
        local_1a8[0]._8_8_ = plVar3[3];
        local_1b8._0_8_ = local_1a8;
      }
      else {
        local_1a8[0]._0_8_ = paVar4->_M_allocated_capacity;
        local_1b8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar3;
      }
      local_1b8._8_8_ = plVar3[1];
      *plVar3 = (long)paVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_allocated_capacity != &local_1e8) {
        operator_delete((void *)local_1f8._M_allocated_capacity,
                        CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) +
                        1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ - local_1d8._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_types(const Const_Proxy_Function &t_func,
          bool t_dot_notation,
          const chaiscript::detail::Dispatch_Engine &t_ss)
      {
        int arity = t_func->get_arity();
        std::vector<Type_Info> types = t_func->get_param_types();

        std::string retval;
        if (arity == -1)
        {
          retval = "(...)";
          if (t_dot_notation)
          {
            retval = "(Object)." + retval;
          }
        } else if (types.size() <= 1) {
          retval = "()";
        } else {
          std::stringstream ss;
          ss << "(";

          std::string paramstr;

          for (size_t index = 1;
               index != types.size();
               ++index)
          {
            paramstr += (types[index].is_const()?"const ":"");
            paramstr += t_ss.get_type_name(types[index]);

            if (index == 1 && t_dot_notation)
            {
              paramstr += ").(";
              if (types.size() == 2)
              {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);

          ss << ")";
          retval = ss.str();
        }


        std::shared_ptr<const dispatch::Dynamic_Proxy_Function> dynfun 
          = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_func);

        if (dynfun)
        {
          Proxy_Function f = dynfun->get_guard();

          if (f)
          {
            auto dynfunguard = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(f);
            if (dynfunguard)
            {
              retval += " : " + format_guard(dynfunguard->get_parse_tree());
            }
          }

          retval += "\n          Defined at " + format_location(dynfun->get_parse_tree());        
        }

        return retval;
      }